

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

axbStatus_t op_vec_axpy(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x,void *aux_data)

{
  size_t sVar1;
  void *pvVar2;
  double *pdVar3;
  void *pvVar4;
  size_t sVar5;
  
  sVar1 = y->size;
  if (sVar1 != 0) {
    pvVar2 = y->data;
    pdVar3 = (double *)alpha->data;
    pvVar4 = x->data;
    sVar5 = 0;
    do {
      *(double *)((long)pvVar2 + sVar5 * 8) =
           *pdVar3 * *(double *)((long)pvVar4 + sVar5 * 8) + *(double *)((long)pvVar2 + sVar5 * 8);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return 0;
}

Assistant:

static axbStatus_t op_vec_axpy(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x, void *aux_data)
{
  (void)aux_data;

        double *d_y     =       (double*)y->data;
  const double *d_alpha = (const double*)alpha->data;
  const double *d_x     = (const double*)x->data;

  for (size_t i=0; i<y->size; ++i) d_y[i] += *d_alpha * d_x[i];

  return 0;
}